

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O0

EStatusCode __thiscall
FromTransparencyGroupWriter::OnFormXObjectWrite
          (FromTransparencyGroupWriter *this,ObjectIDType inFormXObjectID,
          ObjectIDType inFormXObjectResourcesDictionaryID,DictionaryContext *inFormDictionaryContext
          ,ObjectsContext *inPDFWriterObjectContext,DocumentContext *inDocumentContext)

{
  EStatusCode EVar1;
  DictionaryContext *pDVar2;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  DictionaryContext *local_78;
  DictionaryContext *transparencyGroup;
  allocator<char> local_59;
  string local_58;
  DocumentContext *local_38;
  DocumentContext *inDocumentContext_local;
  ObjectsContext *inPDFWriterObjectContext_local;
  DictionaryContext *inFormDictionaryContext_local;
  ObjectIDType inFormXObjectResourcesDictionaryID_local;
  ObjectIDType inFormXObjectID_local;
  FromTransparencyGroupWriter *this_local;
  
  local_38 = inDocumentContext;
  inDocumentContext_local = (DocumentContext *)inPDFWriterObjectContext;
  inPDFWriterObjectContext_local = (ObjectsContext *)inFormDictionaryContext;
  inFormDictionaryContext_local = (DictionaryContext *)inFormXObjectResourcesDictionaryID;
  inFormXObjectResourcesDictionaryID_local = inFormXObjectID;
  inFormXObjectID_local = (ObjectIDType)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Group",&local_59);
  DictionaryContext::WriteKey(inFormDictionaryContext,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pDVar2 = ObjectsContext::StartDictionary((ObjectsContext *)inDocumentContext_local);
  local_78 = pDVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Type",&local_99);
  DictionaryContext::WriteKey(pDVar2,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  pDVar2 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Group",&local_c1);
  DictionaryContext::WriteNameValue(pDVar2,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pDVar2 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"CS",&local_e9);
  DictionaryContext::WriteKey(pDVar2,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  pDVar2 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"DeviceRGB",&local_111);
  DictionaryContext::WriteNameValue(pDVar2,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  pDVar2 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"S",&local_139);
  DictionaryContext::WriteKey(pDVar2,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  pDVar2 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"Transparency",&local_161)
  ;
  DictionaryContext::WriteNameValue(pDVar2,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  pDVar2 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"I",&local_189);
  DictionaryContext::WriteKey(pDVar2,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  DictionaryContext::WriteBooleanValue(local_78,true);
  EVar1 = ObjectsContext::EndDictionary((ObjectsContext *)inDocumentContext_local,local_78);
  return EVar1;
}

Assistant:

virtual PDFHummus::EStatusCode OnFormXObjectWrite(
                        ObjectIDType inFormXObjectID,
                        ObjectIDType inFormXObjectResourcesDictionaryID,
                        DictionaryContext* inFormDictionaryContext,
                        ObjectsContext* inPDFWriterObjectContext,
                        PDFHummus::DocumentContext* inDocumentContext){
            inFormDictionaryContext->WriteKey("Group");
            DictionaryContext* transparencyGroup = inPDFWriterObjectContext->StartDictionary();
            transparencyGroup->WriteKey("Type");
            transparencyGroup->WriteNameValue("Group");
            transparencyGroup->WriteKey("CS");
            transparencyGroup->WriteNameValue("DeviceRGB");
            transparencyGroup->WriteKey("S");
            transparencyGroup->WriteNameValue("Transparency");
            transparencyGroup->WriteKey("I");
            transparencyGroup->WriteBooleanValue(true);
            return inPDFWriterObjectContext->EndDictionary(transparencyGroup);
        }